

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall
cmMakefile::GetConfigurations
          (string *__return_storage_ptr__,cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,bool singleConfig)

{
  uint uVar1;
  cmGlobalGenerator *pcVar2;
  char *pcVar3;
  ulong uVar4;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  value_type local_b8;
  value_type *local_98;
  string *buildType;
  string local_88;
  allocator local_51;
  string local_50;
  char *local_30;
  char *configTypes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool singleConfig_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs_local;
  cmMakefile *this_local;
  
  configTypes._7_1_ = singleConfig;
  pvStack_20 = configs;
  configs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (cmMakefile *)__return_storage_ptr__;
  pcVar2 = GetGlobalGenerator(this);
  uVar1 = (*pcVar2->_vptr_cmGlobalGenerator[0x1f])();
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"CMAKE_BUILD_TYPE",&local_d9);
    pcVar3 = GetSafeDefinition(this,&local_d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,pcVar3,&local_da);
    std::allocator<char>::~allocator((allocator<char> *)&local_da);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    local_98 = &local_b8;
    if ((configTypes._7_1_ & 1) != 0) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvStack_20,local_98);
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"CMAKE_CONFIGURATION_TYPES",&local_51);
    pcVar3 = GetDefinition(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_30 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_88,pcVar3,(allocator *)((long)&buildType + 7));
      cmSystemTools::ExpandListArgument(&local_88,pvStack_20,false);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&buildType + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",(allocator *)((long)&buildType + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&buildType + 6));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetConfigurations(std::vector<std::string>& configs,
                                          bool singleConfig) const
{
  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    if (const char* configTypes =
          this->GetDefinition("CMAKE_CONFIGURATION_TYPES")) {
      cmSystemTools::ExpandListArgument(configTypes, configs);
    }
    return "";
  }
  const std::string& buildType = this->GetSafeDefinition("CMAKE_BUILD_TYPE");
  if (singleConfig && !buildType.empty()) {
    configs.push_back(buildType);
  }
  return buildType;
}